

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirMODULE(void)

{
  aint value;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  size_t modNameSz;
  char *n;
  
  pcVar2 = GetID(&lp);
  if ((pcVar2 == (char *)0x0) || (pcVar3 = strchr(pcVar2,0x2e), pcVar3 != (char *)0x0)) {
    if (pcVar2 == (char *)0x0) {
      Error("[MODULE] Syntax error in <name>",bp,SUPPRESS);
    }
    else {
      Error("[MODULE] Dots not allowed in <module_name>",pcVar2,SUPPRESS);
    }
  }
  else {
    if (ModuleName[0] != '\0') {
      sVar4 = strlen(ModuleName);
      strncat(ModuleName,".",0x7ff - sVar4);
    }
    sVar4 = strlen(ModuleName);
    strncat(ModuleName,pcVar2,0x7ff - sVar4);
    if (vorlabp != (char *)0x0) {
      free(vorlabp);
    }
    sVar4 = strlen(ModuleName);
    vorlabp = (char *)malloc(sVar4 + 3);
    memcpy(vorlabp,ModuleName,sVar4);
    vorlabp[sVar4] = '.';
    vorlabp[sVar4 + 1] = '_';
    vorlabp[sVar4 + 2] = '\0';
    bVar1 = IsSldExportActive();
    value = CurAddress;
    if (bVar1) {
      pcVar2 = ExportModuleToSld(false);
      WriteToSldFile(-1,value,'L',pcVar2);
    }
  }
  return;
}

Assistant:

static void dirMODULE() {
	char* n = GetID(lp);
	if (n && (nullptr == STRCHR(n, '.'))) {
		if (*ModuleName) STRCAT(ModuleName, LINEMAX-1-strlen(ModuleName), ".");
		STRCAT(ModuleName, LINEMAX-1-strlen(ModuleName), n);
		// reset non-local label to default "<modules>._"
		if (vorlabp) free(vorlabp);
		auto modNameSz = strlen(ModuleName);
		vorlabp = (char*)malloc(modNameSz + 3);
		memcpy(vorlabp, ModuleName, modNameSz);
		vorlabp[modNameSz++] = '.';
		vorlabp[modNameSz++] = '_';
		vorlabp[modNameSz] = 0;

		if (IsSldExportActive()) {
			WriteToSldFile(-1, CurAddress, 'L', ExportModuleToSld());
		}
	} else {
		if (n) {
			Error("[MODULE] Dots not allowed in <module_name>", n, SUPPRESS);
		} else {
			Error("[MODULE] Syntax error in <name>", bp, SUPPRESS);
		}
	}
}